

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::olangfilter_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  stringformatter local_130;
  char local_128 [8];
  string msg;
  int state;
  int argc_local;
  char **args_local;
  int cid_local;
  
  bVar1 = QServ::getlastSA(&qs);
  if (bVar1) {
    msg._256_4_ = atoi(args[1]);
    if ((msg._256_4_ == 0) || (msg._256_4_ == 1)) {
      QServ::setoLang(&qs,msg._256_4_ != 0);
    }
    else {
      iVar2 = QServ::getSender(&qs);
      pcVar3 = QServ::getCommandDesc(&qs,cid);
      sendf(iVar2,1,"ris",0x23,pcVar3);
    }
  }
  else {
    stringformatter::stringformatter(&local_130,local_128);
    bVar1 = QServ::isLangWarnOn(&qs);
    pcVar3 = "Off";
    if (bVar1) {
      pcVar3 = "On";
    }
    stringformatter::operator()(&local_130,"%s",pcVar3);
    iVar2 = QServ::getSender(&qs);
    sendf(iVar2,1,"ris",0x23,local_128);
  }
  return;
}

Assistant:

QSERV_CALLBACK olangfilter_cmd(p) {
        if(CMD_SA) {
            int state = atoi(args[1]);

            if(state == 0 or state == 1) {
                qs.setoLang(state);
            } else {
                sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
            }
        } else {
            defformatstring(msg)("%s", (qs.isLangWarnOn() == 1) ? "On" : "Off");
            sendf(CMD_SENDER, 1, "ris", N_SERVMSG, msg);
        }
    }